

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O0

void __thiscall OpenMD::LocalIndexManager::LocalIndexManager(LocalIndexManager *this)

{
  long in_RDI;
  IndexListContainer *this_00;
  int maxIndex;
  int minIndex;
  IndexListContainer *in_stack_ffffffffffffffe0;
  
  maxIndex = 0;
  minIndex = 0x7fffffff;
  IndexListContainer::IndexListContainer(in_stack_ffffffffffffffe0,0x7fffffff,0);
  this_00 = (IndexListContainer *)(in_RDI + 0x20);
  IndexListContainer::IndexListContainer(this_00,minIndex,maxIndex);
  IndexListContainer::IndexListContainer(this_00,minIndex,maxIndex);
  IndexListContainer::IndexListContainer(this_00,minIndex,maxIndex);
  IndexListContainer::IndexListContainer(this_00,minIndex,maxIndex);
  IndexListContainer::IndexListContainer(this_00,minIndex,maxIndex);
  IndexListContainer::IndexListContainer(this_00,minIndex,maxIndex);
  return;
}

Assistant:

int getNextAtomIndex() { return atomIndexContainer_.pop(); }